

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O0

double __thiscall
Alg::max_cover_lazy_budget_fast_end
          (Alg *this,Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list
          ,double epsilon,double *timeb,int mode)

{
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_00;
  allocator<bool> *paVar1;
  size_t sVar2;
  double dVar3;
  size_t sVar4;
  reference pvVar5;
  pointer pvVar6;
  reference pvVar7;
  reference pvVar8;
  ostream *poVar9;
  size_type sVar10;
  const_reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  size_type sVar14;
  reference pvVar15;
  reference pvVar16;
  type_conflict *ptVar17;
  unsigned_long uVar18;
  ulong uVar19;
  reference puVar20;
  reference puVar21;
  iterator iVar22;
  iterator iVar23;
  uint uVar24;
  value_type *__n;
  long lVar25;
  bool bVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  pair<unsigned_int,_double> pVar39;
  reference rVar40;
  double finalInf_cost;
  uint local_534;
  iterator iStack_530;
  uint nodeIdx_1;
  iterator __end5_1;
  iterator __begin5_1;
  value_type *__range5_1;
  _Bit_type local_510;
  reference local_508;
  size_type local_4f8;
  unsigned_long edgeIdx_1;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  _Bit_type local_4d0;
  uint *local_4c8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_4c0;
  uint *local_4b8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_4b0;
  value_type_conflict local_4a4;
  size_type local_4a0;
  size_t miss_idxpair_1;
  size_t idxpair_1;
  double max_coverage_ratio;
  value_type_conflict local_480 [2];
  pair<unsigned_long,_double> *local_478;
  pair<unsigned_long,_double> *local_470;
  pair<unsigned_int,_double> local_468;
  size_type local_458;
  size_t miss_idxpair;
  double local_448;
  size_type local_440;
  size_t idxpair;
  undefined1 local_430 [8];
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  vecNodeLastPair;
  value_type_conflict local_410;
  value_type_conflict local_40c;
  value_type_conflict local_408;
  value_type_conflict local_404;
  value_type_conflict local_400;
  value_type_conflict local_3fc;
  size_type local_3f8;
  size_type miss_idxBound;
  double local_3e8;
  double miss_deg_thr;
  size_type miss_idx;
  size_t tmp_miss_idx_cost;
  size_t sStack_3c8;
  bool is_stop;
  double vecBound_Budget_Last;
  size_t lastNum;
  size_t idxBound_1;
  double vecBound_Budget;
  Nodelist vecBound_1;
  size_t degBound_1;
  double currDeg_1;
  size_type sStack_378;
  value_type argmaxIdx_1;
  size_t idx_1;
  value_type *vecNode_1;
  size_t degidx;
  Timer timerBound;
  undefined1 local_338 [8];
  vector<bool,_std::allocator<bool>_> node_sel_cost;
  undefined1 local_308 [8];
  vector<bool,_std::allocator<bool>_> edgeMark_cost;
  undefined1 local_2d8 [8];
  RRsets missMap_cost;
  vector<unsigned_long,_std::allocator<unsigned_long>_> miss_nodes_vec;
  double sumBudget_cost;
  size_t sumInf_cost;
  double dStack_290;
  uint32_t i_3;
  double deg_thr_1;
  size_t tmpidx_cost;
  undefined1 local_278 [8];
  RRsets degMap_cost;
  double deg_thr;
  size_t maxIdx_cost;
  size_t deg_cost;
  value_type vStack_240;
  uint32_t i_2;
  double minDeg_cost;
  double maxDeg_cost;
  value_type_conflict4 local_228;
  undefined1 local_220 [8];
  vector<double,_std::allocator<double>_> coverage_cost;
  double finalInf;
  iterator iStack_1f8;
  uint nodeIdx;
  iterator __end6;
  iterator __begin6;
  value_type *__range6;
  _Bit_type local_1d8;
  reference local_1d0;
  size_type local_1c0;
  unsigned_long edgeIdx;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  value_type_conflict local_18c;
  size_type local_188;
  size_type idxBound;
  Nodelist vecBound;
  size_t degBound;
  value_type currDeg;
  size_type sStack_150;
  value_type argmaxIdx;
  size_type idx;
  value_type *vecNode;
  size_t deg_1;
  double min_cost;
  undefined1 local_128 [8];
  vector<bool,_std::allocator<bool>_> node_sel;
  undefined1 local_f8 [8];
  vector<bool,_std::allocator<bool>_> edgeMark;
  ulong uStack_c8;
  int flag;
  size_t sumInf;
  uint32_t i_1;
  RRsets degMap;
  size_t deg;
  value_type *pvStack_90;
  uint32_t i;
  size_t maxDeg;
  allocator<unsigned_long> local_71;
  value_type_conflict2 local_70;
  undefined1 local_68 [8];
  FRset coverage;
  double EPS;
  int mode_local;
  double *timeb_local;
  double epsilon_local;
  vector<double,_std::allocator<double>_> *budget_list_local;
  double budget_local;
  Graph *graph_local;
  Alg *this_local;
  
  coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3ddb7cdfd9d7bdbb;
  this->__boundLast = 1.79769313486232e+308;
  this->__boundMin = 1.79769313486232e+308;
  this->__boundLast_inf = 1.79769313486232e+308;
  this->__boundMin_inf = 1.79769313486232e+308;
  this->__boundLast_inf_cost = 1.79769313486232e+308;
  this->__boundMin_inf_cost = 1.79769313486232e+308;
  uVar24 = this->__numV;
  local_70 = 0;
  std::allocator<unsigned_long>::allocator(&local_71);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,(ulong)uVar24,
             &local_70,&local_71);
  std::allocator<unsigned_long>::~allocator(&local_71);
  pvStack_90 = (value_type *)0x0;
  deg._4_4_ = this->__numV;
  while (uVar24 = deg._4_4_ - 1, deg._4_4_ != 0) {
    pvVar5 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](&(this->__hyperG)._FRsets,(ulong)uVar24);
    pvVar6 = (pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar5);
    degMap.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar6;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,
                        (ulong)uVar24);
    *pvVar7 = (value_type)pvVar6;
    deg._4_4_ = uVar24;
    if (pvStack_90 <
        degMap.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pvStack_90 = degMap.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&sumInf + 7));
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)&i_1,(size_type)
                   ((long)&(pvStack_90->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start + 1),
           (allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
           ((long)&sumInf + 7));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&sumInf + 7));
  sumInf._0_4_ = this->__numV;
  while (uVar24 = (uint32_t)sumInf - 1, (uint32_t)sumInf != 0) {
    sumInf._0_4_ = uVar24;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,
                        (ulong)uVar24);
    if (*pvVar7 != 0) {
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,
                          (ulong)(uint32_t)sumInf);
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)&i_1,*pvVar7);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (pvVar8,(value_type_conflict *)&sumInf);
    }
  }
  uStack_c8 = 0;
  edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  sVar10 = this->__numRRsets;
  node_sel.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  paVar1 = (allocator<bool> *)
           ((long)&node_sel.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage + 6);
  sumInf._0_4_ = uVar24;
  std::allocator<bool>::allocator(paVar1);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_f8,sVar10,
             (bool *)((long)&node_sel.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage + 7),paVar1);
  std::allocator<bool>::~allocator
            ((allocator<bool> *)
             ((long)&node_sel.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 6));
  uVar24 = this->__numV;
  min_cost._7_1_ = 0;
  std::allocator<bool>::allocator((allocator<bool> *)((long)&min_cost + 6));
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_128,(ulong)uVar24,
             (bool *)((long)&min_cost + 7),(allocator<bool> *)((long)&min_cost + 6));
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&min_cost + 6));
  deg_1 = (size_t)min_vector_nonzero_mask
                            (budget_list,(vector<bool,_std::allocator<bool>_> *)local_128);
  poVar9 = std::operator<<((ostream *)&std::cout,"min_cost: ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(double)deg_1);
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->__vecSeed_inf);
  vecNode = pvStack_90;
  while ((vecNode != (value_type *)0x0 && ((double)deg_1 <= budget))) {
    idx = (size_type)
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *)&i_1,(size_type)vecNode);
    sStack_150 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)idx);
    do {
      while( true ) {
        sVar10 = sStack_150 - 1;
        bVar26 = sStack_150 == 0;
        sStack_150 = sVar10;
        if (bVar26) goto LAB_0010b433;
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)idx,sVar10);
        currDeg._4_4_ = *pvVar13;
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,
                            (ulong)currDeg._4_4_);
        if (vecNode <= (value_type *)*pvVar7) break;
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)&i_1,(size_type)*pvVar7);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (pvVar8,(value_type_conflict *)((long)&currDeg + 4));
      }
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          (budget_list,(ulong)currDeg._4_4_);
      if (*pvVar11 <= budget) {
        if (mode == 2) {
          vecBound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)vecNode;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxBound);
          local_188 = sStack_150;
          pvVar8 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 *)&i_1,(size_type)
                                        vecBound.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar8,local_188);
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,
                              (ulong)*pvVar13);
          local_18c = (value_type_conflict)*pvVar7;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxBound,&local_18c);
          iVar22 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxBound);
          iVar23 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxBound);
          uVar18 = std::
                   accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_long>
                             ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               )iVar22._M_current,
                              (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               )iVar23._M_current,0);
          lVar25 = uVar18 + uStack_c8;
          auVar29._8_4_ = (int)((ulong)lVar25 >> 0x20);
          auVar29._0_8_ = lVar25;
          auVar29._12_4_ = 0x45300000;
          sVar2 = this->__numRRsets;
          auVar35._8_4_ = (int)(sVar2 >> 0x20);
          auVar35._0_8_ = sVar2;
          auVar35._12_4_ = 0x45300000;
          this->__boundLast_inf =
               (((auVar29._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0)) *
               (double)this->__numV) /
               ((auVar35._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
          if (this->__boundLast_inf <= this->__boundMin_inf &&
              this->__boundMin_inf != this->__boundLast_inf) {
            this->__boundMin_inf = this->__boundLast_inf;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxBound);
        }
        if (edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage._4_4_ == 0) {
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,
                              (ulong)currDeg._4_4_);
          uStack_c8 = uStack_c8 + *pvVar7;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&this->__vecSeed_inf,(value_type_conflict *)((long)&currDeg + 4));
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,
                              (ulong)currDeg._4_4_);
          *pvVar7 = 0;
          pvVar5 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](&(this->__hyperG)._FRsets,(ulong)currDeg._4_4_);
          __end5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvVar5);
          edgeIdx = (unsigned_long)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvVar5);
          while( true ) {
            bVar26 = __gnu_cxx::operator!=
                               (&__end5,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)&edgeIdx);
            if (!bVar26) break;
            puVar20 = __gnu_cxx::
                      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator*(&__end5);
            local_1c0 = *puVar20;
            rVar40 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_f8,local_1c0);
            local_1d0 = rVar40;
            bVar26 = std::_Bit_reference::operator_cast_to_bool(&local_1d0);
            if (!bVar26) {
              rVar40 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)local_f8,local_1c0);
              local_1d8 = rVar40._M_mask;
              __range6 = (value_type *)rVar40._M_p;
              std::_Bit_reference::operator=((_Bit_reference *)&__range6,true);
              pvVar8 = std::
                       vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ::operator[](&(this->__hyperG)._RRsets,local_1c0);
              __end6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar8);
              iStack_1f8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar8);
              while( true ) {
                bVar26 = __gnu_cxx::operator!=(&__end6,&stack0xfffffffffffffe08);
                if (!bVar26) break;
                puVar21 = __gnu_cxx::
                          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          ::operator*(&__end6);
                uVar24 = *puVar21;
                pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_68,(ulong)uVar24);
                if (*pvVar7 != 0) {
                  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                      local_68,(ulong)uVar24);
                  *pvVar7 = *pvVar7 - 1;
                }
                __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator++(&__end6);
              }
            }
            __gnu_cxx::
            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator++(&__end5);
          }
        }
        edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._4_4_ =
             edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage._4_4_ + 1;
      }
    } while (edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage._4_4_ != 2);
LAB_0010b433:
    if (edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._4_4_ == 2) break;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::pop_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)&i_1);
    vecNode = (value_type *)
              ((long)&vecNode[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  }
  auVar30._8_4_ = (int)(uStack_c8 >> 0x20);
  auVar30._0_8_ = uStack_c8;
  auVar30._12_4_ = 0x45300000;
  sVar2 = this->__numRRsets;
  auVar36._8_4_ = (int)(sVar2 >> 0x20);
  auVar36._0_8_ = sVar2;
  auVar36._12_4_ = 0x45300000;
  coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)((((auVar30._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uStack_c8) - 4503599627370496.0)) *
                 (double)this->__numV) /
                ((auVar36._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)));
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"  >>>[greedy-lazy] influence: ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,uStack_c8);
  poVar9 = std::operator<<(poVar9," ");
  poVar9 = (ostream *)
           std::ostream::operator<<
                     (poVar9,(double)coverage_cost.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
  poVar9 = std::operator<<(poVar9,", min-bound: ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->__boundMin_inf);
  poVar9 = std::operator<<(poVar9,", last-bound: ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->__boundLast_inf);
  std::operator<<(poVar9,'\n');
  uVar24 = this->__numV;
  local_228 = 0.0;
  std::allocator<double>::allocator((allocator<double> *)((long)&maxDeg_cost + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_220,(ulong)uVar24,&local_228,
             (allocator<double> *)((long)&maxDeg_cost + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&maxDeg_cost + 7));
  minDeg_cost = 0.0;
  vStack_240 = 1.79769313486232e+308;
  deg_cost._4_4_ = this->__numV;
  while (uVar24 = deg_cost._4_4_ - 1, deg_cost._4_4_ != 0) {
    pvVar5 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](&(this->__hyperG)._FRsets,(ulong)uVar24);
    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar5);
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,(ulong)uVar24);
    if ((ABS(*pvVar11) <= 1e-10) || (sVar10 == 0)) {
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_220,(ulong)uVar24);
      *pvVar12 = 0.0;
    }
    else {
      auVar31._8_4_ = (int)(sVar10 >> 0x20);
      auVar31._0_8_ = sVar10;
      auVar31._12_4_ = 0x45300000;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,(ulong)uVar24);
      dVar28 = *pvVar11;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_220,(ulong)uVar24);
      *pvVar12 = ((auVar31._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar10) - 4503599627370496.0)) / dVar28;
    }
    pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_220,(ulong)uVar24);
    if (minDeg_cost < *pvVar12) {
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_220,(ulong)uVar24);
      minDeg_cost = *pvVar12;
    }
    pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_220,(ulong)uVar24);
    deg_cost._4_4_ = uVar24;
    if (*pvVar12 < vStack_240) {
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_220,(ulong)uVar24);
      if (1e-10 < ABS(*pvVar12)) {
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_220,(ulong)uVar24);
        vStack_240 = *pvVar12;
      }
    }
  }
  poVar9 = std::operator<<((ostream *)&std::cout,"minDeg_cost: ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,vStack_240);
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  deg_thr = 0.0;
  for (degMap_cost.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)minDeg_cost;
      vStack_240 * (1.0 - epsilon) <=
      (double)degMap_cost.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      degMap_cost.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((double)degMap_cost.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage * (1.0 - epsilon)))
  {
    deg_thr = (double)((long)deg_thr + 1);
  }
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&tmpidx_cost + 7));
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_278,(size_type)deg_thr,
           (allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
           ((long)&tmpidx_cost + 7));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&tmpidx_cost + 7));
  poVar9 = std::operator<<((ostream *)&std::cout,"maxIdx_cost: ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(ulong)deg_thr);
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  deg_thr_1 = deg_thr;
  for (dStack_290 = minDeg_cost; deg_thr_1 = (double)((long)deg_thr_1 + -1),
      vStack_240 * (1.0 - epsilon) <= dStack_290; dStack_290 = dStack_290 * (1.0 - epsilon)) {
    sumInf_cost._4_4_ = this->__numV;
    while (uVar24 = sumInf_cost._4_4_ - 1, sumInf_cost._4_4_ != 0) {
      sumInf_cost._4_4_ = uVar24;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_220,(ulong)uVar24);
      if (dStack_290 <= *pvVar12) {
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_220,
                             (ulong)sumInf_cost._4_4_);
        if (*pvVar12 <= dStack_290 / (1.0 - epsilon)) {
          pvVar8 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 *)local_278,(size_type)deg_thr_1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (pvVar8,(value_type_conflict *)((long)&sumInf_cost + 4));
        }
      }
    }
    sumInf_cost._4_4_ = uVar24;
    if (deg_thr_1 == 0.0) break;
  }
  sumBudget_cost = 0.0;
  miss_nodes_vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &missMap_cost.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = (allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
            ((long)&edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(this_00);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_2d8,(size_type)deg_thr,this_00);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 7));
  sVar10 = this->__numRRsets;
  node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  paVar1 = (allocator<bool> *)
           ((long)&node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage + 6);
  std::allocator<bool>::allocator(paVar1);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_308,sVar10,
             (bool *)((long)&node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage + 7),paVar1);
  std::allocator<bool>::~allocator
            ((allocator<bool> *)
             ((long)&node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 6));
  uVar24 = this->__numV;
  timerBound.__processName._7_1_ = 0;
  paVar1 = (allocator<bool> *)((long)&timerBound.__processName + 6);
  std::allocator<bool>::allocator(paVar1);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_338,(ulong)uVar24,
             (bool *)((long)&timerBound.__processName + 7),paVar1);
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&timerBound.__processName + 6));
  deg_1 = (size_t)min_vector_nonzero_mask
                            (budget_list,(vector<bool,_std::allocator<bool>_> *)local_338);
  Timer::Timer((Timer *)&degidx,"Bound");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->__vecSeed_inf_cost);
  vecNode_1 = (value_type *)
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::size((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)local_278);
LAB_0010bcac:
  __n = (value_type *)
        ((long)&vecNode_1[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  if ((vecNode_1 == (value_type *)0x0) ||
     (budget < (double)miss_nodes_vec.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + (double)deg_1)) {
    auVar34._8_4_ = (int)((ulong)sumBudget_cost >> 0x20);
    auVar34._0_8_ = sumBudget_cost;
    auVar34._12_4_ = 0x45300000;
    sVar2 = this->__numRRsets;
    auVar38._8_4_ = (int)(sVar2 >> 0x20);
    auVar38._0_8_ = sVar2;
    auVar38._12_4_ = 0x45300000;
    this_local = (Alg *)((((auVar34._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,SUB84(sumBudget_cost,0)) - 4503599627370496.0
                          )) * (double)this->__numV) /
                        ((auVar38._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)));
    vecNode_1 = __n;
    poVar9 = std::operator<<((ostream *)&std::cout,"  >>>[greedy-lazy] influence_cost: ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(ulong)sumBudget_cost);
    poVar9 = std::operator<<(poVar9," ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(double)this_local);
    poVar9 = std::operator<<(poVar9,", min-bound_cost: ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->__boundMin_inf_cost);
    poVar9 = std::operator<<(poVar9,", last-bound_cost: ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->__boundLast_inf_cost);
    std::operator<<(poVar9,'\n');
    if ((double)coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage <= (double)this_local) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->__vecSeed);
      iVar22 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (&this->__vecSeed_inf_cost);
      iVar23 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         (&this->__vecSeed_inf_cost);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      assign<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->__vecSeed,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )iVar22._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )iVar23._M_current);
      poVar9 = std::operator<<((ostream *)&std::cout,"Cost Inf: ");
      sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->__vecSeed);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar10);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      this->__is_inf_cost = true;
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->__vecSeed);
      iVar22 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->__vecSeed_inf)
      ;
      iVar23 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->__vecSeed_inf);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      assign<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->__vecSeed,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )iVar22._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )iVar23._M_current);
      poVar9 = std::operator<<((ostream *)&std::cout,"Inf: ");
      sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->__vecSeed);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar10);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      this->__is_inf_cost = false;
      this_local = (Alg *)coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
    }
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_338);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_308);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_2d8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &missMap_cost.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_278);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_220);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_128);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_f8);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&i_1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
    return (double)this_local;
  }
  vecNode_1 = __n;
  idx_1 = (size_t)std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)local_278,(size_type)__n);
  sStack_378 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)idx_1);
LAB_0010bd7c:
  sVar10 = sStack_378 - 1;
  bVar26 = sStack_378 != 0;
  sStack_378 = sVar10;
  if (bVar26) {
    pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)idx_1,sVar10);
    currDeg_1._4_4_ = *pvVar13;
    pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_220,(ulong)currDeg_1._4_4_
                        );
    dVar28 = *pvVar12;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        (budget_list,(ulong)currDeg_1._4_4_);
    if ((double)miss_nodes_vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage + *pvVar11 <= budget) {
      if (mode == 2) {
LAB_0010be62:
        Timer::get_operation_time((Timer *)&degidx);
        vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)vecNode_1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget);
        idxBound_1 = 0;
        lastNum = sStack_378 + 1;
        vecBound_Budget_Last = 0.0;
        sStack_3c8 = 0;
        tmp_miss_idx_cost._7_1_ = 0;
        miss_idx = 0;
        miss_deg_thr = (double)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          &missMap_cost.
                                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_0010bee2:
        if (miss_deg_thr != 0.0) {
          miss_deg_thr = (double)((long)miss_deg_thr + -1);
          miss_idx = (size_type)deg_thr;
          for (local_3e8 = minDeg_cost; miss_idx = miss_idx - 1,
              vStack_240 * (1.0 - epsilon) <= local_3e8; local_3e8 = local_3e8 * (1.0 - epsilon)) {
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                &missMap_cost.
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (size_type)miss_deg_thr);
            pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_220,*pvVar7);
            if (local_3e8 <= *pvVar12) {
              pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  &missMap_cost.
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (size_type)miss_deg_thr);
              pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)local_220,*pvVar7);
              if (*pvVar12 <= local_3e8 / (1.0 - epsilon)) {
                pvVar8 = std::
                         vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       *)local_2d8,miss_idx);
                pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    &missMap_cost.
                                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (size_type)miss_deg_thr);
                miss_idxBound._4_4_ = (undefined4)*pvVar7;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          (pvVar8,(value_type_conflict *)((long)&miss_idxBound + 4));
                break;
              }
            }
            if (miss_idx == 0) break;
          }
          goto LAB_0010bee2;
        }
        miss_deg_thr = (double)((long)miss_deg_thr + -1);
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)local_2d8,
                              (size_type)
                              vecBound_1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_3f8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
        if ((tmp_miss_idx_cost._7_1_ & 1) == 0) {
          while( true ) {
            sVar4 = idxBound_1;
            sVar2 = lastNum;
            bVar26 = (double)idxBound_1 + (double)deg_1 <= budget;
            if (bVar26) {
              lastNum = lastNum - 1;
            }
            if (!bVar26 || sVar2 == 0) goto LAB_0010c313;
            pvVar8 = std::
                     vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   *)local_278,
                                  (size_type)
                                  vecBound_1.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar8,lastNum);
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                (budget_list,(ulong)*pvVar13);
            if (budget < (double)sVar4 + *pvVar11) break;
            pvVar8 = std::
                     vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   *)local_278,
                                  (size_type)
                                  vecBound_1.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar8,lastNum);
            pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_220,
                                 (ulong)*pvVar13);
            dVar27 = *pvVar12;
            pvVar8 = std::
                     vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   *)local_278,
                                  (size_type)
                                  vecBound_1.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar8,lastNum);
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                (budget_list,(ulong)*pvVar13);
            local_3fc = (value_type_conflict)(long)(dVar27 * *pvVar11);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget,
                       &local_3fc);
            sVar2 = idxBound_1;
            pvVar8 = std::
                     vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   *)local_278,
                                  (size_type)
                                  vecBound_1.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar8,lastNum);
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                (budget_list,(ulong)*pvVar13);
            idxBound_1 = (size_t)((double)sVar2 + *pvVar11);
            vecBound_Budget_Last = (double)((long)vecBound_Budget_Last + 1);
          }
          pvVar8 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 *)local_278,
                                (size_type)
                                vecBound_1.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar8,lastNum);
          pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_220,(ulong)*pvVar13)
          ;
          local_400 = (value_type_conflict)(long)(*pvVar12 * (budget - (double)idxBound_1));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget,
                     &local_400);
          tmp_miss_idx_cost._7_1_ = 1;
          idxBound_1 = (size_t)budget;
LAB_0010c313:
          do {
            sVar2 = idxBound_1;
            sVar10 = local_3f8;
            bVar26 = (double)idxBound_1 + (double)deg_1 <= budget;
            if (bVar26) {
              local_3f8 = local_3f8 - 1;
            }
            if (!bVar26 || sVar10 == 0) break;
            pvVar8 = std::
                     vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   *)local_2d8,
                                  (size_type)
                                  vecBound_1.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar8,local_3f8);
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                (budget_list,(ulong)*pvVar13);
            if (budget < (double)sVar2 + *pvVar11) goto LAB_0010c4f9;
            pvVar8 = std::
                     vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   *)local_2d8,
                                  (size_type)
                                  vecBound_1.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar8,local_3f8);
            pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_220,
                                 (ulong)*pvVar13);
            dVar27 = *pvVar12;
            pvVar8 = std::
                     vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   *)local_2d8,
                                  (size_type)
                                  vecBound_1.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar8,local_3f8);
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                (budget_list,(ulong)*pvVar13);
            local_404 = (value_type_conflict)(long)(dVar27 * *pvVar11);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget,
                       &local_404);
            sVar2 = idxBound_1;
            pvVar8 = std::
                     vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   *)local_2d8,
                                  (size_type)
                                  vecBound_1.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar8,local_3f8);
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                (budget_list,(ulong)*pvVar13);
            idxBound_1 = (size_t)((double)sVar2 + *pvVar11);
            vecBound_Budget_Last = (double)((long)vecBound_Budget_Last + 1);
          } while( true );
        }
        goto LAB_0010c581;
      }
      if (mode == 1) {
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (budget_list,(ulong)currDeg_1._4_4_);
        if (budget < (double)miss_nodes_vec.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + *pvVar11 +
                     (double)deg_1) goto LAB_0010be62;
      }
      goto LAB_0010d4d5;
    }
    pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_220,(ulong)currDeg_1._4_4_
                        );
    if (1e-10 < ABS(*pvVar12)) {
      finalInf_cost = (double)(ulong)currDeg_1._4_4_;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &missMap_cost.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (value_type_conflict2 *)&finalInf_cost);
    }
    pvVar8 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)local_278,(size_type)vecNode_1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(pvVar8);
    goto LAB_0010d9c7;
  }
  goto LAB_0010d9e5;
LAB_0010c4f9:
  pvVar8 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)local_2d8,
                        (size_type)
                        vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar8,local_3f8);
  pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)local_220,(ulong)*pvVar13);
  local_408 = (value_type_conflict)(long)(*pvVar12 * (budget - (double)idxBound_1));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget,&local_408);
  tmp_miss_idx_cost._7_1_ = 1;
  idxBound_1 = (size_t)budget;
LAB_0010c581:
  if ((tmp_miss_idx_cost._7_1_ & 1) == 0) {
LAB_0010c597:
    bVar26 = false;
    if ((double)idxBound_1 + (double)deg_1 <= budget) {
      vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)vecBound_1.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + -1);
      bVar26 = vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage != (pointer)0x0;
    }
    if (bVar26) {
      vecBound_Budget_Last = 0.0;
      sStack_3c8 = idxBound_1;
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)local_278,
                            (size_type)
                            vecBound_1.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      lastNum = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)local_2d8,
                            (size_type)
                            vecBound_1.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      local_3f8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
      while( true ) {
        sVar4 = idxBound_1;
        sVar2 = lastNum;
        bVar26 = (double)idxBound_1 + (double)deg_1 <= budget;
        if (bVar26) {
          lastNum = lastNum - 1;
        }
        if (!bVar26 || sVar2 == 0) goto LAB_0010c8b5;
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)local_278,
                              (size_type)
                              vecBound_1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar8,lastNum);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (budget_list,(ulong)*pvVar13);
        if (budget < (double)sVar4 + *pvVar11) break;
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)local_278,
                              (size_type)
                              vecBound_1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar8,lastNum);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_220,(ulong)*pvVar13);
        dVar27 = *pvVar12;
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)local_278,
                              (size_type)
                              vecBound_1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar8,lastNum);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (budget_list,(ulong)*pvVar13);
        local_40c = (value_type_conflict)(long)(dVar27 * *pvVar11);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget,
                   &local_40c);
        sVar2 = idxBound_1;
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)local_278,
                              (size_type)
                              vecBound_1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar8,lastNum);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (budget_list,(ulong)*pvVar13);
        idxBound_1 = (size_t)((double)sVar2 + *pvVar11);
        vecBound_Budget_Last = (double)((long)vecBound_Budget_Last + 1);
      }
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)local_278,
                            (size_type)
                            vecBound_1.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar8,lastNum)
      ;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_220,(ulong)*pvVar13);
      local_410 = (value_type_conflict)(long)(*pvVar12 * (budget - (double)idxBound_1));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget,&local_410)
      ;
      tmp_miss_idx_cost._7_1_ = 1;
      idxBound_1 = (size_t)budget;
LAB_0010c8b5:
      do {
        sVar2 = idxBound_1;
        sVar10 = local_3f8;
        bVar26 = (double)idxBound_1 + (double)deg_1 <= budget;
        if (bVar26) {
          local_3f8 = local_3f8 - 1;
        }
        if (!bVar26 || sVar10 == 0) goto LAB_0010cb21;
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)local_2d8,
                              (size_type)
                              vecBound_1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar8,local_3f8);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (budget_list,(ulong)*pvVar13);
        if (budget < (double)sVar2 + *pvVar11) goto LAB_0010ca9b;
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)local_2d8,
                              (size_type)
                              vecBound_1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar8,local_3f8);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_220,(ulong)*pvVar13);
        dVar27 = *pvVar12;
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)local_2d8,
                              (size_type)
                              vecBound_1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar8,local_3f8);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (budget_list,(ulong)*pvVar13);
        vecNodeLastPair.
        super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             (undefined4)(long)(dVar27 * *pvVar11);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget,
                   (value_type_conflict *)
                   ((long)&vecNodeLastPair.
                           super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        sVar2 = idxBound_1;
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)local_2d8,
                              (size_type)
                              vecBound_1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar8,local_3f8);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (budget_list,(ulong)*pvVar13);
        idxBound_1 = (size_t)((double)sVar2 + *pvVar11);
        vecBound_Budget_Last = (double)((long)vecBound_Budget_Last + 1);
      } while( true );
    }
  }
LAB_0010cb3a:
  if ((vecBound_Budget_Last == 0.0) || (lastNum == 0)) {
    if ((lastNum == 0) && ((double)idxBound_1 < budget)) {
      idxpair_1 = 0;
      vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)vecBound_1.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage - 1);
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)local_278,
                            (size_type)
                            vecBound_1.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      miss_idxpair_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
      while (miss_idxpair_1 != 0) {
        miss_idxpair_1 = miss_idxpair_1 - 1;
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)local_278,
                              (size_type)
                              vecBound_1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar8,miss_idxpair_1);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_220,(ulong)*pvVar13);
        if ((double)idxpair_1 < *pvVar12) {
          pvVar8 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 *)local_278,
                                (size_type)
                                vecBound_1.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar8,miss_idxpair_1);
          pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_220,(ulong)*pvVar13)
          ;
          idxpair_1 = (size_t)*pvVar12;
        }
      }
      miss_idxpair_1 = miss_idxpair_1 - 1;
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)local_2d8,
                            (size_type)
                            vecBound_1.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      local_4a0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
      while (local_4a0 != 0) {
        local_4a0 = local_4a0 - 1;
        pvVar8 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)local_2d8,
                              (size_type)
                              vecBound_1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar8,local_4a0);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_220,(ulong)*pvVar13);
        if ((double)idxpair_1 < *pvVar12) {
          pvVar8 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 *)local_2d8,
                                (size_type)
                                vecBound_1.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar8,local_4a0);
          pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_220,(ulong)*pvVar13)
          ;
          idxpair_1 = (size_t)*pvVar12;
        }
      }
      local_4a4 = (value_type_conflict)(long)((double)idxpair_1 * (budget - (double)idxBound_1));
      local_4a0 = local_4a0 - 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget,&local_4a4)
      ;
    }
  }
  else {
    for (; vecBound_Budget_Last != 0.0;
        vecBound_Budget_Last = (double)((long)vecBound_Budget_Last + -1)) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget);
    }
    idxBound_1 = sStack_3c8;
    pvVar8 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)local_278,
                          (size_type)
                          vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
    pvVar8 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)local_2d8,
                          (size_type)
                          vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
    std::allocator<std::pair<unsigned_long,_double>_>::allocator
              ((allocator<std::pair<unsigned_long,_double>_> *)((long)&idxpair + 7));
    std::
    vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>::
    vector((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
            *)local_430,sVar10 + sVar14,
           (allocator<std::pair<unsigned_long,_double>_> *)((long)&idxpair + 7));
    std::allocator<std::pair<unsigned_long,_double>_>::~allocator
              ((allocator<std::pair<unsigned_long,_double>_> *)((long)&idxpair + 7));
    pvVar8 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)local_278,
                          (size_type)
                          vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_440 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
    while (local_440 != 0) {
      local_440 = local_440 - 1;
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)local_278,
                            (size_type)
                            vecBound_1.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (pvVar8,local_440);
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)local_278,
                            (size_type)
                            vecBound_1.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (pvVar8,local_440);
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_220,(ulong)*pvVar15);
      pVar39 = std::make_pair<unsigned_int&,double&>(pvVar13,pvVar12);
      local_448 = pVar39.second;
      miss_idxpair._0_4_ = pVar39.first;
      pvVar16 = std::
                vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              *)local_430,local_440);
      std::pair<unsigned_long,double>::operator=
                ((pair<unsigned_long,double> *)pvVar16,(pair<unsigned_int,_double> *)&miss_idxpair);
    }
    local_440 = local_440 - 1;
    pvVar8 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)local_2d8,
                          (size_type)
                          vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_458 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
    while (local_458 != 0) {
      local_458 = local_458 - 1;
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)local_2d8,
                            (size_type)
                            vecBound_1.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (pvVar8,local_458);
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)local_2d8,
                            (size_type)
                            vecBound_1.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (pvVar8,local_458);
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_220,(ulong)*pvVar15);
      pVar39 = std::make_pair<unsigned_int&,double&>(pvVar13,pvVar12);
      sVar10 = local_458;
      local_468.second = pVar39.second;
      local_468.first = pVar39.first;
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)local_278,
                            (size_type)
                            vecBound_1.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
      pvVar16 = std::
                vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              *)local_430,sVar10 + sVar14);
      std::pair<unsigned_long,double>::operator=((pair<unsigned_long,double> *)pvVar16,&local_468);
    }
    local_458 = local_458 - 1;
    local_470 = (pair<unsigned_long,_double> *)
                std::
                vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ::begin((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                         *)local_430);
    local_478 = (pair<unsigned_long,_double> *)
                std::
                vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ::end((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                       *)local_430);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,Alg::max_cover_lazy_budget_fast_end(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double,double&,int)::__0>
              (local_470,local_478);
    pvVar8 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)local_278,
                          (size_type)
                          vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
    pvVar8 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)local_2d8,
                          (size_type)
                          vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
    lastNum = sVar10 + sVar14;
    while( true ) {
      sVar4 = idxBound_1;
      sVar2 = lastNum;
      bVar26 = (double)idxBound_1 + (double)deg_1 <= budget;
      if (bVar26) {
        lastNum = lastNum - 1;
      }
      if (!bVar26 || sVar2 == 0) break;
      pvVar16 = std::
                vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              *)local_430,lastNum);
      ptVar17 = std::get<0ul,unsigned_long,double>(pvVar16);
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,*ptVar17);
      if (budget < (double)sVar4 + *pvVar11) {
        pvVar16 = std::
                  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                *)local_430,lastNum);
        ptVar17 = std::get<0ul,unsigned_long,double>(pvVar16);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_220,*ptVar17);
        max_coverage_ratio._4_4_ = (undefined4)(long)(*pvVar12 * (budget - (double)idxBound_1));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget,
                   (value_type_conflict *)((long)&max_coverage_ratio + 4));
        idxBound_1 = (size_t)budget;
      }
      else {
        pvVar16 = std::
                  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                *)local_430,lastNum);
        ptVar17 = std::get<0ul,unsigned_long,double>(pvVar16);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_220,*ptVar17);
        dVar27 = *pvVar12;
        pvVar16 = std::
                  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                *)local_430,lastNum);
        ptVar17 = std::get<0ul,unsigned_long,double>(pvVar16);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,*ptVar17);
        local_480[0] = (value_type_conflict)(long)(dVar27 * *pvVar11);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget,local_480
                  );
        sVar2 = idxBound_1;
        pvVar16 = std::
                  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                *)local_430,lastNum);
        ptVar17 = std::get<0ul,unsigned_long,double>(pvVar16);
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,*ptVar17);
        idxBound_1 = (size_t)((double)sVar2 + *pvVar11);
      }
    }
    std::
    vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>::
    ~vector((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
             *)local_430);
  }
  local_4b0._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget);
  local_4b8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &vecBound_Budget);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (local_4b0,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_4b8);
  make_min_heap((Nodelist *)&vecBound_Budget);
  local_4c0._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget);
  local_4c8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &vecBound_Budget);
  uVar18 = std::
           accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_long>
                     (local_4c0,
                      (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       )local_4c8,0);
  lVar25 = uVar18 + (long)sumBudget_cost;
  auVar32._8_4_ = (int)((ulong)lVar25 >> 0x20);
  auVar32._0_8_ = lVar25;
  auVar32._12_4_ = 0x45300000;
  sVar2 = this->__numRRsets;
  auVar37._8_4_ = (int)(sVar2 >> 0x20);
  auVar37._0_8_ = sVar2;
  auVar37._12_4_ = 0x45300000;
  this->__boundLast_inf_cost =
       (((auVar32._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0)) * (double)this->__numV) /
       ((auVar37._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
  if (this->__boundLast_inf_cost <= this->__boundMin_inf_cost &&
      this->__boundMin_inf_cost != this->__boundLast_inf_cost) {
    this->__boundMin_inf_cost = this->__boundLast_inf_cost;
  }
  dVar27 = Timer::get_operation_time((Timer *)&degidx);
  *timeb = dVar27 + *timeb;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget);
LAB_0010d4d5:
  auVar33._8_4_ = (int)((ulong)sumBudget_cost >> 0x20);
  auVar33._0_8_ = sumBudget_cost;
  auVar33._12_4_ = 0x45300000;
  pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                      (budget_list,(ulong)currDeg_1._4_4_);
  dVar28 = dVar28 * *pvVar11 +
           (auVar33._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,SUB84(sumBudget_cost,0)) - 4503599627370496.0);
  uVar19 = (ulong)dVar28;
  sumBudget_cost = (double)(uVar19 | (long)(dVar28 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->__vecSeed_inf_cost,(value_type_conflict *)((long)&currDeg_1 + 4));
  pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                      (budget_list,(ulong)currDeg_1._4_4_);
  miss_nodes_vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((double)miss_nodes_vec.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + *pvVar11);
  pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)local_220,(ulong)currDeg_1._4_4_);
  *pvVar12 = 0.0;
  rVar40 = std::vector<bool,_std::allocator<bool>_>::operator[]
                     ((vector<bool,_std::allocator<bool>_> *)local_338,(ulong)currDeg_1._4_4_);
  local_4d0 = rVar40._M_mask;
  __range4 = (value_type *)rVar40._M_p;
  std::_Bit_reference::operator=((_Bit_reference *)&__range4,true);
  deg_1 = (size_t)min_vector_nonzero_mask
                            (budget_list,(vector<bool,_std::allocator<bool>_> *)local_338);
  pvVar5 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](&(this->__hyperG)._FRsets,(ulong)currDeg_1._4_4_);
  __end4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvVar5);
  edgeIdx_1 = (unsigned_long)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvVar5)
  ;
  while( true ) {
    bVar26 = __gnu_cxx::operator!=
                       (&__end4,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)&edgeIdx_1);
    if (!bVar26) break;
    puVar20 = __gnu_cxx::
              __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator*(&__end4);
    local_4f8 = *puVar20;
    rVar40 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_308,local_4f8);
    local_508 = rVar40;
    bVar26 = std::_Bit_reference::operator_cast_to_bool(&local_508);
    if (!bVar26) {
      rVar40 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_308,local_4f8);
      local_510 = rVar40._M_mask;
      __range5_1 = (value_type *)rVar40._M_p;
      std::_Bit_reference::operator=((_Bit_reference *)&__range5_1,true);
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&(this->__hyperG)._RRsets,local_4f8);
      __end5_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar8);
      iStack_530 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar8);
      while( true ) {
        bVar26 = __gnu_cxx::operator!=(&__end5_1,&stack0xfffffffffffffad0);
        if (!bVar26) break;
        puVar21 = __gnu_cxx::
                  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&__end5_1);
        local_534 = *puVar21;
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_220,(ulong)local_534);
        if (1e-10 < ABS(*pvVar12)) {
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              (budget_list,(ulong)local_534);
          if (ABS(*pvVar11) < 1e-10) {
            pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_220,
                                 (ulong)local_534);
            *pvVar12 = 0.0;
          }
          else {
            pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_220,
                                 (ulong)local_534);
            dVar28 = *pvVar12;
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                (budget_list,(ulong)local_534);
            dVar27 = *pvVar11;
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                (budget_list,(ulong)local_534);
            dVar3 = *pvVar11;
            pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_220,
                                 (ulong)local_534);
            *pvVar12 = (dVar28 * dVar27 + -1.0) / dVar3;
          }
        }
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end5_1);
      }
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end4);
  }
  pvVar8 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)local_278,(size_type)vecNode_1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(pvVar8);
LAB_0010d9c7:
  if (budget < (double)miss_nodes_vec.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + (double)deg_1) goto LAB_0010d9e5;
  goto LAB_0010bd7c;
LAB_0010ca9b:
  pvVar8 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)local_2d8,
                        (size_type)
                        vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar8,local_3f8);
  pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)local_220,(ulong)*pvVar13);
  vecNodeLastPair.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       (undefined4)(long)(*pvVar12 * (budget - (double)idxBound_1));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget,
             (value_type_conflict *)
             &vecNodeLastPair.
              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tmp_miss_idx_cost._7_1_ = 1;
  idxBound_1 = (size_t)budget;
LAB_0010cb21:
  if ((tmp_miss_idx_cost._7_1_ & 1) == 1) goto LAB_0010cb3a;
  goto LAB_0010c597;
LAB_0010d9e5:
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::pop_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_278);
  goto LAB_0010bcac;
}

Assistant:

double Alg::max_cover_lazy_budget_fast_end(const Graph & graph, const double budget,
        const std::vector<double> & budget_list, const double epsilon, double & timeb, const int mode) {
    // mode: optimization mode.
    // 0->no optimization,
    // 1->optimization with the upper bound in the last round,
    // 2->optimization with minimum upper bound among all rounds [Default].
    const double EPS = 0.0000000001;
    __boundLast = DBL_MAX, __boundMin = DBL_MAX;
    __boundLast_inf = DBL_MAX, __boundMin_inf = DBL_MAX;
    __boundLast_inf_cost = DBL_MAX, __boundMin_inf_cost = DBL_MAX;
    FRset coverage(__numV, 0);
    size_t maxDeg = 0;
    for (auto i = __numV; i--;) {
        const size_t deg = __hyperG._FRsets[i].size();
        coverage[i] = deg;
        if (deg > maxDeg) {
            maxDeg = deg;
        }
    }
    RRsets degMap(maxDeg + 1); // degMap: map degree to the nodes with this degree
    for (auto i = __numV; i--;) {
        if (coverage[i] == 0) {
            continue;
        }
        degMap[coverage[i]].push_back(i);
    }

    size_t sumInf = 0;
    int flag = 0;
    std::vector<bool> edgeMark(__numRRsets, false);
    // check if an edge is removed
    std::vector<bool> node_sel(__numV, false);
    double min_cost = min_vector_nonzero_mask(budget_list, node_sel);
    std::cout << "min_cost: " << min_cost << std::endl;

    __vecSeed_inf.clear();
    for (size_t deg = maxDeg; deg > 0; deg--) // Enusre deg > 0
    {
        if (min_cost > budget) {
            break;
        }
        auto & vecNode = degMap[deg];
        for (auto idx = vecNode.size(); idx--;) {
            auto argmaxIdx = vecNode[idx];
            const auto currDeg = coverage[argmaxIdx];
            if (deg > currDeg)
            {
                degMap[currDeg].push_back(argmaxIdx);
                continue;
            }
            if (budget_list[argmaxIdx] <= budget) {
                if (mode == 2) {
                    // Find upper bound
                    auto degBound = deg;
                    Nodelist vecBound;
                    // Initialize vecBound
                    auto idxBound = idx;
                    vecBound.push_back(coverage[degMap[degBound][idxBound]]);
                    __boundLast_inf = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0))
                                             + sumInf) * __numV /__numRRsets;
                    if (__boundMin_inf > __boundLast_inf) {
                        __boundMin_inf = __boundLast_inf;
                    }
                }
                if (flag == 0) {
                    sumInf = sumInf + coverage[argmaxIdx];
                    __vecSeed_inf.push_back(argmaxIdx);
                    coverage[argmaxIdx] = 0;
                    for (auto edgeIdx : __hyperG._FRsets[argmaxIdx])
                    {
                        if (edgeMark[edgeIdx]) continue;
                        edgeMark[edgeIdx] = true;
                        for (auto nodeIdx : __hyperG._RRsets[edgeIdx])
                        {
                            if (coverage[nodeIdx] == 0) continue; // This node is seed, skip
                            coverage[nodeIdx]--;
                        }
                    }
                }
                flag = flag + 1;
            }
            if (flag == 2) {
                break;
            }
        }
        if (flag == 2) {
            break;
        }
        degMap.pop_back();
    }
    // Top-k influential nodes constructed
    const auto finalInf = 1.0 * sumInf * __numV / __numRRsets;
    std::cout << std::endl;
    std::cout << "  >>>[greedy-lazy] influence: " << sumInf << " " << finalInf <<
              ", min-bound: " << __boundMin_inf <<
              ", last-bound: " << __boundLast_inf << '\n';

    // cost influence most
    std::vector<double> coverage_cost(__numV, 0);
    double maxDeg_cost = 0;
    double minDeg_cost = DBL_MAX;
    for (auto i = __numV; i--;) {
        const size_t deg_cost = __hyperG._FRsets[i].size();
        if (fabs(budget_list[i]) <= EPS || deg_cost == 0) {
            coverage_cost[i] = 0;
        }
        else {
            coverage_cost[i] = (double) deg_cost / budget_list[i];
        }
        if (coverage_cost[i] > maxDeg_cost) {
            maxDeg_cost = coverage_cost[i];
        }
        if (coverage_cost[i] < minDeg_cost) {
            if (fabs(coverage_cost[i]) > EPS) {
                minDeg_cost = coverage_cost[i];
            }
        }
    }
    std::cout << "minDeg_cost: " <<  minDeg_cost << std::endl;

    size_t maxIdx_cost = 0;
    for (double deg_thr = maxDeg_cost; deg_thr >= minDeg_cost * (1 - epsilon); deg_thr = deg_thr * (1 - epsilon)) {
        maxIdx_cost++;
    }

    // initial reverse index
    RRsets degMap_cost(maxIdx_cost); // degMap: map degree threshold to the nodes over this threshold
    std::cout << "maxIdx_cost: " << maxIdx_cost << std::endl;
    size_t tmpidx_cost = maxIdx_cost - 1;
    for (double deg_thr = maxDeg_cost; deg_thr >= minDeg_cost * (1 - epsilon); deg_thr = deg_thr * (1 - epsilon)) {
        for (auto i = __numV; i--; ) {
            if (coverage_cost[i] >= deg_thr && coverage_cost[i] <= deg_thr / (1 - epsilon)) {
                degMap_cost[tmpidx_cost].push_back(i);
            }
        }
        if (tmpidx_cost == 0) {
            break;
        }
        tmpidx_cost--;
    }

    size_t sumInf_cost = 0;
    double sumBudget_cost = 0;
    // miss nodes
    std::vector<size_t> miss_nodes_vec;
    RRsets missMap_cost(maxIdx_cost);
    // check if an edge is removed
    std::vector<bool> edgeMark_cost(__numRRsets, false);
    std::vector<bool> node_sel_cost(__numV, false);
    min_cost = min_vector_nonzero_mask(budget_list, node_sel_cost);

    Timer timerBound("Bound");
    __vecSeed_inf_cost.clear();
    for (size_t degidx = degMap_cost.size(); degidx--; ) {
        if (sumBudget_cost + min_cost > budget) {
            break;
        }
        auto & vecNode = degMap_cost[degidx];
        for (size_t idx = vecNode.size(); idx--;) {
            auto argmaxIdx = vecNode[idx];
            const double currDeg = coverage_cost[argmaxIdx];
            if (sumBudget_cost + budget_list[argmaxIdx] <= budget) {
                if (mode == 2 || (mode == 1 && sumBudget_cost + budget_list[argmaxIdx] + min_cost > budget)) {
                    timerBound.get_operation_time();
                    // Find upper bound
                    auto degBound = degidx;
                    Nodelist vecBound;
                    double vecBound_Budget = 0;
                    // Initialize vecBound
                    auto idxBound = idx + 1;
                    size_t lastNum = 0;
                    double vecBound_Budget_Last = 0;
                    bool is_stop = false;
                    size_t tmp_miss_idx_cost = 0;
                    for (auto miss_idx = miss_nodes_vec.size(); miss_idx--; ) {
                        tmp_miss_idx_cost = maxIdx_cost - 1;
                        for (double miss_deg_thr = maxDeg_cost;
                                miss_deg_thr >= minDeg_cost * (1 - epsilon); miss_deg_thr = miss_deg_thr * (1 - epsilon)) {
                            if (coverage_cost[miss_nodes_vec[miss_idx]] >= miss_deg_thr &&
                                    coverage_cost[miss_nodes_vec[miss_idx]] <= miss_deg_thr / (1 - epsilon)) {
                                missMap_cost[tmp_miss_idx_cost].push_back(miss_nodes_vec[miss_idx]);
                                break;
                            }
                            if (tmp_miss_idx_cost == 0) {
                                break;
                            }
                            tmp_miss_idx_cost--;
                        }
                    }
                    auto miss_idxBound = missMap_cost[degBound].size();
                    if (is_stop == false) {
                        while (vecBound_Budget + min_cost <= budget && idxBound--) {
                            if (vecBound_Budget + budget_list[degMap_cost[degBound][idxBound]] <= budget) {
                                vecBound.push_back(coverage_cost[degMap_cost[degBound][idxBound]] *
                                                   budget_list[degMap_cost[degBound][idxBound]]);
                                vecBound_Budget = vecBound_Budget + budget_list[degMap_cost[degBound][idxBound]];
                                lastNum = lastNum + 1;
                            }
                            else {
                                vecBound.push_back(coverage_cost[degMap_cost[degBound][idxBound]] *
                                                   (budget - vecBound_Budget));
                                vecBound_Budget = budget;
                                is_stop = true;
                                break;
                            }
                        }
                        while (vecBound_Budget + min_cost <= budget && miss_idxBound--) {
                            if (vecBound_Budget + budget_list[missMap_cost[degBound][miss_idxBound]] <= budget) {
                                vecBound.push_back(coverage_cost[missMap_cost[degBound][miss_idxBound]] *
                                                   budget_list[missMap_cost[degBound][miss_idxBound]]);
                                vecBound_Budget = vecBound_Budget + budget_list[missMap_cost[degBound][miss_idxBound]];
                                lastNum = lastNum + 1;
                            }
                            else {
                                vecBound.push_back(coverage_cost[missMap_cost[degBound][miss_idxBound]] *
                                                   (budget - vecBound_Budget));
                                vecBound_Budget = budget;
                                is_stop = true;
                                break;
                            }
                        }
                    }
                    if (is_stop == false) {
                        while (vecBound_Budget + min_cost <= budget && --degBound) {
                            lastNum = 0;
                            vecBound_Budget_Last = vecBound_Budget;
                            idxBound = degMap_cost[degBound].size();
                            miss_idxBound = missMap_cost[degBound].size();
                            while (vecBound_Budget + min_cost <= budget && idxBound--) {
                                if (vecBound_Budget + budget_list[degMap_cost[degBound][idxBound]] <= budget) {
                                    vecBound.push_back(coverage_cost[degMap_cost[degBound][idxBound]] *
                                                       budget_list[degMap_cost[degBound][idxBound]]);
                                    vecBound_Budget = vecBound_Budget + budget_list[degMap_cost[degBound][idxBound]];
                                    lastNum = lastNum + 1;
                                }
                                else {
                                    vecBound.push_back(coverage_cost[degMap_cost[degBound][idxBound]] *
                                                       (budget - vecBound_Budget));
                                    vecBound_Budget = budget;
                                    is_stop = true;
                                    break;
                                }
                            }
                            while (vecBound_Budget + min_cost <= budget && miss_idxBound--) {
                                if (vecBound_Budget + budget_list[missMap_cost[degBound][miss_idxBound]] <= budget) {
                                    vecBound.push_back(coverage_cost[missMap_cost[degBound][miss_idxBound]] *
                                                       budget_list[missMap_cost[degBound][miss_idxBound]]);
                                    vecBound_Budget = vecBound_Budget + budget_list[missMap_cost[degBound][miss_idxBound]];
                                    lastNum = lastNum + 1;
                                }
                                else {
                                    vecBound.push_back(coverage_cost[missMap_cost[degBound][miss_idxBound]] *
                                                       (budget - vecBound_Budget));
                                    vecBound_Budget = budget;
                                    is_stop = true;
                                    break;
                                }
                            }
                            if (is_stop == true) {
                                break;
                            }
                        }
                    }
                    // roll back
                    if (lastNum != 0 && idxBound != 0) {
                        while (lastNum) {
                            vecBound.pop_back();
                            lastNum = lastNum - 1;
                        }
                        vecBound_Budget = vecBound_Budget_Last;
                        std::vector<std::pair<size_t, double>> vecNodeLastPair(degMap_cost[degBound].size()
                            + missMap_cost[degBound].size());
                        for (size_t idxpair = degMap_cost[degBound].size(); idxpair--; ) {
                            vecNodeLastPair[idxpair] = std::make_pair(degMap_cost[degBound][idxpair],
                                                                      coverage_cost[degMap_cost[degBound][idxpair]]);
                        }
                        for (size_t miss_idxpair = missMap_cost[degBound].size(); miss_idxpair--; ){
                            vecNodeLastPair[miss_idxpair + degMap_cost[degBound].size()] =
                                    std::make_pair(missMap_cost[degBound][miss_idxpair],
                                            coverage_cost[missMap_cost[degBound][miss_idxpair]]);
                        }
                        std::sort(vecNodeLastPair.begin(), vecNodeLastPair.end(), [](auto & left, auto & right){
                            return std::get<1>(left) < std::get<1>(right);
                        });
                        // choose max
                        idxBound = degMap_cost[degBound].size() + missMap_cost[degBound].size();
                        while (vecBound_Budget + min_cost <= budget && idxBound--) {
                            if (vecBound_Budget + budget_list[std::get<0>(vecNodeLastPair[idxBound])] <= budget) {
                                vecBound.push_back(coverage_cost[std::get<0>(vecNodeLastPair[idxBound])] *
                                                   budget_list[std::get<0>(vecNodeLastPair[idxBound])]);
                                vecBound_Budget = vecBound_Budget + budget_list[std::get<0>(vecNodeLastPair[idxBound])];
                            }
                            else {
                                vecBound.push_back(coverage_cost[std::get<0>(vecNodeLastPair[idxBound])] *
                                                   (budget- vecBound_Budget));
                                vecBound_Budget = budget;
                            }
                        }
                    }
                    else if (idxBound == 0 && vecBound_Budget < budget) {
                        double max_coverage_ratio = 0.0;
                        degBound = degBound - 1;
                        for (size_t idxpair = degMap_cost[degBound].size(); idxpair--; ) {
                            if (coverage_cost[degMap_cost[degBound][idxpair]] > max_coverage_ratio) {
                                max_coverage_ratio = coverage_cost[degMap_cost[degBound][idxpair]];
                            }
                        }
                        for (size_t miss_idxpair = missMap_cost[degBound].size(); miss_idxpair--; ) {
                            if (coverage_cost[missMap_cost[degBound][miss_idxpair]] > max_coverage_ratio) {
                                max_coverage_ratio = coverage_cost[missMap_cost[degBound][miss_idxpair]];
                            }
                        }
                        vecBound.push_back(max_coverage_ratio * (budget- vecBound_Budget));
                    }
                    std::sort(vecBound.begin(), vecBound.end());
                    make_min_heap(vecBound);
                    __boundLast_inf_cost = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0))
                                                  + sumInf_cost) * __numV /__numRRsets;
                    if (__boundMin_inf_cost > __boundLast_inf_cost) {
                        __boundMin_inf_cost = __boundLast_inf_cost;
                    }
                    timeb += timerBound.get_operation_time();
                }
                sumInf_cost = sumInf_cost + currDeg * budget_list[argmaxIdx];
                __vecSeed_inf_cost.push_back(argmaxIdx);
                sumBudget_cost = sumBudget_cost + budget_list[argmaxIdx];
                coverage_cost[argmaxIdx] = 0;
                node_sel_cost[argmaxIdx] = true;
                min_cost = min_vector_nonzero_mask(budget_list, node_sel_cost);
                for (auto edgeIdx : __hyperG._FRsets[argmaxIdx]) {
                    if (edgeMark_cost[edgeIdx]) {
                        continue;
                    }
                    edgeMark_cost[edgeIdx] = true;
                    for (auto nodeIdx : __hyperG._RRsets[edgeIdx]) {
                        if (fabs(coverage_cost[nodeIdx]) <= EPS) {
                            continue; // This node is seed, skip
                        }
                        if (fabs(budget_list[nodeIdx]) >= EPS) {
                            coverage_cost[nodeIdx] = (coverage_cost[nodeIdx] * budget_list[nodeIdx] - 1) /
                                                     budget_list[nodeIdx];
                        } else {
                            coverage_cost[nodeIdx] = 0;
                        }
                    }
                }
                degMap_cost[degidx].pop_back();
            }
            else {
                if (fabs(coverage_cost[argmaxIdx]) > EPS) {
                    miss_nodes_vec.push_back(argmaxIdx);
//                    std::cout << "miss node size: " << miss_nodes_vec.size() << std::endl;
                }
                degMap_cost[degidx].pop_back();
            }
            if (sumBudget_cost + min_cost > budget) {
                break;
            }
        }
        degMap_cost.pop_back();
    }
    const auto finalInf_cost = 1.0 * sumInf_cost * __numV / __numRRsets;
    std::cout << "  >>>[greedy-lazy] influence_cost: " << sumInf_cost << " " <<
              finalInf_cost << ", min-bound_cost: " <<
              __boundMin_inf_cost << ", last-bound_cost: " << __boundLast_inf_cost << '\n';

    if (finalInf > finalInf_cost) {
        __vecSeed.clear();
        __vecSeed.assign(__vecSeed_inf.begin(), __vecSeed_inf.end());
        std::cout << "Inf: " <<  __vecSeed.size() << std::endl;
        __is_inf_cost = false;
        return finalInf;
    }
    else {
        __vecSeed.clear();
        __vecSeed.assign(__vecSeed_inf_cost.begin(), __vecSeed_inf_cost.end());
        std::cout << "Cost Inf: " << __vecSeed.size() << std::endl;
        __is_inf_cost = true;
        return finalInf_cost;
    }
}